

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O1

void __thiscall XPMP2::SoundSystemXP::Unpause(SoundSystemXP *this,uint64_t sndId)

{
  FMOD_RESULT _r;
  SoundChannel *pSVar1;
  int iVar2;
  string local_e0;
  string local_c0;
  string local_a0;
  undefined **local_80 [3];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  pSVar1 = SoundSystem::GetChn(&this->super_SoundSystem,sndId);
  if (((pSVar1 != (SoundChannel *)0x0) && (pSVar1->pChn != (FMOD_CHANNEL *)0x0)) &&
     (0 < pSVar1->nPauseCountdown)) {
    iVar2 = pSVar1->nPauseCountdown + -1;
    pSVar1->nPauseCountdown = iVar2;
    if (iVar2 == 0) {
      gFmodRes = FMOD_Channel_SetPaused(pSVar1->pChn,0);
      if (gFmodRes != FMOD_OK) {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"FMOD_Channel_SetPaused(pChn->pChn, false)","");
        _r = gFmodRes;
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
                   ,"");
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Unpause","");
        FmodError::FmodError((FmodError *)local_80,&local_a0,_r,&local_c0,0x227,&local_e0);
        FmodError::LogErr((FmodError *)local_80);
        local_80[0] = &PTR__FmodError_002e0a18;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&((FmodError *)local_80)->sFunc + 0x10U)) {
          operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&((FmodError *)local_80)->sFile + 0x10U)) {
          operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
        }
        std::runtime_error::~runtime_error((runtime_error *)local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void SoundSystemXP::Unpause ([[maybe_unused]] uint64_t sndId)
{
#if INCLUDE_FMOD_SOUND + 0 >= 1
    SoundChannel* pChn = GetChn(sndId);
    if (!pChn || !pChn->pChn) return;

    if (pChn->ShallUnpause()) {
        FMOD_LOG(FMOD_Channel_SetPaused(pChn->pChn, false));
    }
#endif
}